

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O3

void pp_tree_rb_rotate_right(PTreeRBNode *node,PTreeBaseNode **root)

{
  PTreeRBNode_ *pPVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeRBNode_ *pPVar3;
  
  pPVar1 = (PTreeRBNode_ *)(node->base).left;
  pPVar3 = node->parent;
  if (pPVar3 != (PTreeRBNode_ *)0x0) {
    (&(pPVar3->base).left)[(PTreeRBNode *)(pPVar3->base).left != node] = (PTreeBaseNode_ *)pPVar1;
  }
  pPVar2 = (pPVar1->base).right;
  (node->base).left = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &node->base;
    pPVar3 = node->parent;
  }
  (pPVar1->base).right = &node->base;
  pPVar1->parent = pPVar3;
  node->parent = pPVar1;
  if (pPVar1->parent != (PTreeRBNode_ *)0x0) {
    return;
  }
  *root = (PTreeBaseNode *)pPVar1;
  return;
}

Assistant:

static void
pp_tree_rb_rotate_right (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeBaseNode *tmp_node;

	tmp_node = node->base.left;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == (PTreeBaseNode *) node)
			node->parent->base.left = tmp_node;
		else
			node->parent->base.right = tmp_node;
	}

	node->base.left = tmp_node->right;

	if (tmp_node->right != NULL)
		((PTreeRBNode *) tmp_node->right)->parent = node;

	tmp_node->right = (PTreeBaseNode *) node;
	((PTreeRBNode *) tmp_node)->parent = node->parent;
	node->parent = (PTreeRBNode *) tmp_node;

	if (P_UNLIKELY (((PTreeRBNode *) tmp_node)->parent == NULL))
		*root = tmp_node;
}